

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint i;
  long lVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  int local_2c;
  int local_28;
  int local_24;
  
  local_2c = lastpc;
  pcVar3 = basicgetobjname(p,&local_2c,reg,name);
  iVar2 = local_2c;
  if (pcVar3 != (char *)0x0) {
    return pcVar3;
  }
  if ((long)local_2c == -1) {
    return (char *)0x0;
  }
  i = p->code[local_2c];
  pcVar3 = (char *)0x0;
  switch(i & 0x7f) {
  case 0xb:
    uVar4 = (ulong)(i >> 0x14 & 0xfffffff0);
    pcVar3 = "?";
    if (((&p->k->tt_)[uVar4] & 0xf) == 4) {
      pcVar3 = (char *)(*(long *)((long)&p->k->value_ + uVar4) + 0x18);
    }
    *name = pcVar3;
    lVar1 = *(long *)((long)&p->upvalues->name + (ulong)(i >> 0xc & 0xff0));
    pcVar3 = (char *)(lVar1 + 0x18);
    if (lVar1 == 0) {
      pcVar3 = "?";
    }
    iVar2 = strcmp(pcVar3,"_ENV");
    pcVar3 = "field";
    if (iVar2 == 0) {
      pcVar3 = "global";
    }
    break;
  case 0xc:
    local_28 = local_2c;
    pcVar3 = basicgetobjname(p,&local_28,i >> 0x18,name);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 == 'c')) goto LAB_0013feea;
LAB_0013fee0:
    pcVar3 = "?";
    goto LAB_0013fee7;
  case 0xd:
    *name = "integer index";
    pcVar3 = "field";
    break;
  case 0xe:
    uVar4 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar4] & 0xf) != 4) goto LAB_0013fee0;
    pcVar3 = (char *)(*(long *)((long)&p->k->value_ + uVar4) + 0x18);
LAB_0013fee7:
    *name = pcVar3;
LAB_0013feea:
    pcVar3 = isEnv(p,iVar2,i,0);
    return pcVar3;
  case 0x14:
    if ((short)i < 0) {
      uVar4 = (ulong)((i >> 0x18) << 4);
      if (((&p->k->tt_)[uVar4] & 0xf) != 4) goto LAB_0013ff4f;
      pcVar3 = (char *)(*(long *)((long)&p->k->value_ + uVar4) + 0x18);
LAB_0013ff56:
      *name = pcVar3;
    }
    else {
      local_24 = local_2c;
      pcVar3 = basicgetobjname(p,&local_24,i >> 0x18,name);
      if ((pcVar3 == (char *)0x0) || (*pcVar3 != 'c')) {
LAB_0013ff4f:
        pcVar3 = "?";
        goto LAB_0013ff56;
      }
    }
    pcVar3 = "method";
  }
  return pcVar3;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  const char *kind = basicgetobjname(p, &lastpc, reg, name);
  if (kind != NULL)
    return kind;
  else if (lastpc != -1) {  /* could find instruction? */
    Instruction i = p->code[lastpc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, lastpc, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_SELF: {
        rkname(p, lastpc, i, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}